

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O2

aiLogStream aiGetPredefinedLogStream(aiDefaultLogStream pStream,char *file)

{
  LogStream *pLVar1;
  code *pcVar2;
  aiLogStream aVar3;
  LogStream *stream;
  LogStream *local_10;
  
  pLVar1 = Assimp::LogStream::createDefaultStream(pStream,file,(IOSystem *)0x0);
  local_10 = pLVar1;
  std::__cxx11::list<Assimp::LogStream_*,_std::allocator<Assimp::LogStream_*>_>::push_back
            ((list<Assimp::LogStream_*,_std::allocator<Assimp::LogStream_*>_> *)
             &Assimp::gPredefinedStreams_abi_cxx11_,&local_10);
  pcVar2 = CallbackToLogRedirector;
  if (pLVar1 == (LogStream *)0x0) {
    pcVar2 = (aiLogStreamCallback)0x0;
  }
  aVar3.user = (char *)pLVar1;
  aVar3.callback = pcVar2;
  return aVar3;
}

Assistant:

ASSIMP_API aiLogStream aiGetPredefinedLogStream(aiDefaultLogStream pStream,const char* file)
{
    aiLogStream sout;

    ASSIMP_BEGIN_EXCEPTION_REGION();
    LogStream* stream = LogStream::createDefaultStream(pStream,file);
    if (!stream) {
        sout.callback = NULL;
        sout.user = NULL;
    }
    else {
        sout.callback = &CallbackToLogRedirector;
        sout.user = (char*)stream;
    }
    gPredefinedStreams.push_back(stream);
    ASSIMP_END_EXCEPTION_REGION(aiLogStream);
    return sout;
}